

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

Regexp * __thiscall
re2::CoalesceWalker::PostVisit
          (CoalesceWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  ushort uVar1;
  Regexp *this_00;
  bool bVar2;
  Regexp *pRVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  Regexp **r2ptr;
  
  if (re->nsub_ != 0) {
    if (re->op_ == '\x05') {
      uVar5 = (ulong)re->nsub_;
      if (re->nsub_ != 0) {
        uVar7 = 1;
        do {
          if ((uVar7 < uVar5) &&
             (bVar2 = CanCoalesce(child_args[uVar7 - 1],child_args[uVar7]), bVar2)) {
            uVar5 = (ulong)re->nsub_;
            if (re->nsub_ != 0) {
              r2ptr = child_args + 1;
              uVar7 = 0;
              do {
                uVar7 = uVar7 + 1;
                if ((uVar7 < uVar5) && (bVar2 = CanCoalesce(r2ptr[-1],*r2ptr), bVar2)) {
                  DoCoalesce(r2ptr + -1,r2ptr);
                }
                uVar5 = (ulong)re->nsub_;
                r2ptr = r2ptr + 1;
              } while (uVar7 < uVar5);
            }
            if ((int)uVar5 == 0) {
              iVar6 = 0;
            }
            else {
              uVar7 = 0;
              iVar6 = 0;
              do {
                iVar6 = iVar6 + (uint)(child_args[uVar7]->op_ == '\x02');
                uVar7 = uVar7 + 1;
              } while (uVar5 != uVar7);
            }
            pRVar3 = (Regexp *)operator_new(0x28);
            Regexp::Regexp(pRVar3,(uint)re->op_,(uint)re->parse_flags_);
            Regexp::AllocSub(pRVar3,(uint)re->nsub_ - iVar6);
            if (pRVar3->nsub_ < 2) {
              paVar4 = &pRVar3->field_5;
            }
            else {
              paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
            }
            if (re->nsub_ == 0) {
              return pRVar3;
            }
            uVar5 = 0;
            iVar6 = 0;
            do {
              this_00 = child_args[uVar5];
              if (this_00->op_ == '\x02') {
                Regexp::Decref(this_00);
              }
              else {
                paVar4[iVar6].subone_ = this_00;
                iVar6 = iVar6 + 1;
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 < re->nsub_);
            return pRVar3;
          }
          uVar5 = (ulong)re->nsub_;
          bVar2 = uVar7 < uVar5;
          uVar7 = uVar7 + 1;
        } while (bVar2);
      }
      bVar2 = ChildArgsChanged(re,child_args);
      if (bVar2) {
        pRVar3 = (Regexp *)operator_new(0x28);
        Regexp::Regexp(pRVar3,(uint)re->op_,(uint)re->parse_flags_);
        Regexp::AllocSub(pRVar3,(uint)re->nsub_);
        if (pRVar3->nsub_ < 2) {
          paVar4 = &pRVar3->field_5;
        }
        else {
          paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
        }
        uVar1 = re->nsub_;
        if ((ulong)uVar1 != 0) {
          uVar5 = 0;
          do {
            paVar4[uVar5] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar5);
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        return pRVar3;
      }
    }
    else {
      bVar2 = ChildArgsChanged(re,child_args);
      if (bVar2) {
        pRVar3 = (Regexp *)operator_new(0x28);
        Regexp::Regexp(pRVar3,(uint)re->op_,(uint)re->parse_flags_);
        Regexp::AllocSub(pRVar3,(uint)re->nsub_);
        if (pRVar3->nsub_ < 2) {
          paVar4 = &pRVar3->field_5;
        }
        else {
          paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
        }
        uVar1 = re->nsub_;
        if ((ulong)uVar1 != 0) {
          uVar5 = 0;
          do {
            paVar4[uVar5] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar5);
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        if (re->op_ == '\n') {
          (pRVar3->field_7).field_0.min_ = (re->field_7).field_0.min_;
        }
        else if (re->op_ != '\v') {
          return pRVar3;
        }
        (pRVar3->field_7).field_0.max_ = (re->field_7).field_0.max_;
        return pRVar3;
      }
    }
  }
  pRVar3 = Regexp::Incref(re);
  return pRVar3;
}

Assistant:

Regexp* CoalesceWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  if (re->nsub() == 0)
    return re->Incref();

  if (re->op() != kRegexpConcat) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    // Repeats and Captures have additional data that must be copied.
    if (re->op() == kRegexpRepeat) {
      nre->min_ = re->min();
      nre->max_ = re->max();
    } else if (re->op() == kRegexpCapture) {
      nre->cap_ = re->cap();
    }
    return nre;
  }

  bool can_coalesce = false;
  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1])) {
      can_coalesce = true;
      break;
    }
  }
  if (!can_coalesce) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    return nre;
  }

  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1]))
      DoCoalesce(&child_args[i], &child_args[i+1]);
  }
  // Determine how many empty matches were left by DoCoalesce.
  int n = 0;
  for (int i = n; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch)
      n++;
  }
  // Build a new op.
  Regexp* nre = new Regexp(re->op(), re->parse_flags());
  nre->AllocSub(re->nsub() - n);
  Regexp** nre_subs = nre->sub();
  for (int i = 0, j = 0; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch) {
      child_args[i]->Decref();
      continue;
    }
    nre_subs[j] = child_args[i];
    j++;
  }
  return nre;
}